

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QEasingCurveFunction *func)

{
  int iVar1;
  QDataStream *in_RSI;
  QDataStream *in_RDI;
  QDataStream *unaff_retaddr;
  QList<TCBPoint> *in_stack_ffffffffffffffe8;
  
  if (in_RSI != (QDataStream *)0x0) {
    QDataStream::operator>>(unaff_retaddr,(double *)in_RDI);
    QDataStream::operator>>(unaff_retaddr,(double *)in_RDI);
    QDataStream::operator>>(unaff_retaddr,(double *)in_RDI);
    iVar1 = QDataStream::version(in_RDI);
    if (0x12 < iVar1) {
      operator>>(in_RSI,(QList<QPointF> *)in_stack_ffffffffffffffe8);
      operator>>(in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QEasingCurveFunction *func)
{
    if (func) {
        stream >> func->_p;
        stream >> func->_a;
        stream >> func->_o;
        if (stream.version() > QDataStream::Qt_5_12) {
            stream >> func->_bezierCurves;
            stream >> func->_tcbPoints;
        }
    }
    return stream;
}